

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

bool __thiscall
iutest::detail::iuCartesianProductGenerator<bool,_int,_int>::IsEnd
          (iuCartesianProductGenerator<bool,_int,_int> *this)

{
  bool bVar1;
  iuCartesianProductGenerator<bool,_int,_int> *this_local;
  
  bVar1 = iuCartesianProductGenerator<bool,int,int>::
          is_end_foreach<0,3,std::tuple<iutest::detail::iuParamGenerator<bool>,iutest::detail::iuParamGenerator<int>,iutest::detail::iuParamGenerator<int>>const>
                    ((iuCartesianProductGenerator<bool,int,int> *)this,&this->v,
                     (type **)&iutest_type_traits::enabler_t<void>::value);
  return bVar1;
}

Assistant:

virtual bool IsEnd() const IUTEST_CXX_OVERRIDE
    {
        return is_end_foreach<0, kCount>(v);
    }